

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

bool __thiscall
llama_model_loader::get_key_or_arr<unsigned_int,512ul>
          (llama_model_loader *this,string *key,array<unsigned_int,_512UL> *result,uint32_t n,
          bool required)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  pointer pgVar4;
  undefined8 uVar5;
  runtime_error *prVar6;
  reference pvVar7;
  uint in_ECX;
  string *in_RDX;
  llama_model_loader *in_RSI;
  undefined1 in_R8B;
  uint32_t i;
  bool ok;
  uint value;
  ArrayInfo arr_info;
  int kid;
  undefined4 in_stack_fffffffffffffef8;
  value_type_conflict2 vVar8;
  array<unsigned_int,_512UL> *in_stack_ffffffffffffff00;
  uint local_d0;
  value_type_conflict2 local_c8;
  string local_c0 [28];
  int in_stack_ffffffffffffff5c;
  gguf_context *in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  llama_model_loader *in_stack_ffffffffffffff70;
  string local_80 [35];
  undefined1 local_5d;
  string local_50 [39];
  undefined3 in_stack_ffffffffffffffd8;
  uint uVar9;
  bool local_1;
  
  uVar9 = CONCAT13(in_R8B,in_stack_ffffffffffffffd8) & 0x1ffffff;
  pgVar4 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                     ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_ffffffffffffff00);
  uVar5 = std::__cxx11::string::c_str();
  register0x00000000 = gguf_find_key(pgVar4,uVar5);
  if (register0x00000000 < 0) {
    if ((uVar9 & 0x1000000) != 0) {
      local_5d = 1;
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      uVar5 = std::__cxx11::string::c_str();
      format_abi_cxx11_((char *)local_50,"key not found in model: %s",uVar5);
      std::runtime_error::runtime_error(prVar6,local_50);
      local_5d = 0;
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1 = false;
  }
  else {
    if (0x200 < in_ECX) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      uVar5 = std::__cxx11::string::c_str();
      format_abi_cxx11_((char *)local_80,"n > N_MAX: %u > %u for key %s",(ulong)in_ECX,0x200,uVar5);
      std::runtime_error::runtime_error(prVar6,local_80);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pgVar4 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                       ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_ffffffffffffff00)
    ;
    iVar3 = gguf_get_kv_type(pgVar4,(long)stack0xffffffffffffffd4);
    if (iVar3 == 9) {
      std::unique_ptr<gguf_context,_gguf_context_deleter>::get
                ((unique_ptr<gguf_context,_gguf_context_deleter> *)in_stack_ffffffffffffff00);
      GGUFMeta::GKV<GGUFMeta::ArrayInfo>::get_kv
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      iVar3 = stack0xffffffffffffffd4;
      if ((ulong)in_ECX != CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        uVar5 = std::__cxx11::string::c_str();
        format_abi_cxx11_((char *)local_c0,"key %s has wrong array length; expected %u, got %u",
                          uVar5,(ulong)in_ECX,(ulong)in_stack_ffffffffffffff68);
        std::runtime_error::runtime_error(prVar6,local_c0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar1 = (uint)stack0xffffffffffffffd4 >> 0x18;
      bVar2 = SUB41(uVar1,0);
      unique0x10000369 = iVar3;
      local_1 = get_arr<unsigned_int,512ul>
                          (in_RSI,in_RDX,(array<unsigned_int,_512UL> *)CONCAT44(in_ECX,uVar9),bVar2)
      ;
    }
    else {
      bVar2 = get_key<unsigned_int>
                        (in_stack_ffffffffffffff70,
                         (string *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                         (uint *)in_stack_ffffffffffffff60,
                         SUB41((uint)in_stack_ffffffffffffff5c >> 0x18,0));
      if (bVar2) {
        for (local_d0 = 0; local_d0 < in_ECX; local_d0 = local_d0 + 1) {
          vVar8 = local_c8;
          pvVar7 = std::array<unsigned_int,_512UL>::operator[]
                             (in_stack_ffffffffffffff00,CONCAT44(local_c8,in_stack_fffffffffffffef8)
                             );
          *pvVar7 = vVar8;
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool llama_model_loader::get_key_or_arr(const std::string & key, std::array<T, N_MAX> & result, uint32_t n, bool required) {
        const int kid = gguf_find_key(meta.get(), key.c_str());

        if (kid < 0) {
            if (required) {
                throw std::runtime_error(format("key not found in model: %s", key.c_str()));
            }
            return false;
        }

        if (n > N_MAX) {
            throw std::runtime_error(format("n > N_MAX: %u > %u for key %s", (uint32_t) n, (uint32_t) N_MAX, key.c_str()));
        }

        if (gguf_get_kv_type(meta.get(), kid) == GGUF_TYPE_ARRAY) {
            struct GGUFMeta::ArrayInfo arr_info =
                GGUFMeta::GKV<GGUFMeta::ArrayInfo>::get_kv(meta.get(), kid);

            if (n != arr_info.length) {
                throw std::runtime_error(format("key %s has wrong array length; expected %u, got %u", key.c_str(), n, (uint32_t) arr_info.length));
            }

            return get_arr(key, result, required);
        }

        T value;

        bool ok = get_key(key, value, required);
        if (!ok) {
            return false;
        }

        for (uint32_t i = 0; i < n; i++) {
            result[i] = value;
        }

        return true;
    }